

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::MixedContentModel::validateContentSpecial
          (MixedContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *param_7)

{
  uint uVar1;
  NodeTypes NVar2;
  QName *pQVar3;
  QName *exemplar;
  bool bVar4;
  uint uriId;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  SubstitutionGroupComparator comparator;
  SubstitutionGroupComparator local_40;
  
  local_40.fGrammarResolver = pGrammarResolver;
  local_40.fStringPool = pStringPool;
  if (this->fOrdered == false) {
    if (childCount == 0) {
      return true;
    }
    uVar6 = 0;
    do {
      pQVar3 = children[uVar6];
      if (pQVar3->fURIId != 0xffffffff) {
        uVar5 = this->fCount;
        if (uVar5 == 0) {
LAB_002ec4ae:
          *indexFailingChild = uVar6;
          return false;
        }
        uVar7 = 0;
        uVar8 = 1;
        do {
          if ((uint)this->fChildTypes[uVar7] < 9) {
            exemplar = this->fChildren[uVar7];
            switch(this->fChildTypes[uVar7]) {
            case Leaf:
              bVar4 = SubstitutionGroupComparator::isEquivalentTo(&local_40,pQVar3,exemplar);
              uVar5 = this->fCount;
              if (bVar4) goto switchD_002ec455_caseD_6;
              break;
            case Any:
              goto switchD_002ec455_caseD_6;
            case Any_Other:
              if ((pQVar3->fURIId != 1) && (pQVar3->fURIId != exemplar->fURIId))
              goto switchD_002ec455_caseD_6;
              break;
            case Any_NS:
              if (exemplar->fURIId == pQVar3->fURIId) goto switchD_002ec455_caseD_6;
            }
          }
          bVar4 = uVar8 < uVar5;
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar4);
switchD_002ec455_caseD_6:
        if (uVar5 == uVar7) goto LAB_002ec4ae;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < childCount);
  }
  else {
    if (childCount == 0) {
      return true;
    }
    uVar7 = 0;
    uVar6 = 0;
    uVar5 = 1;
    do {
      uVar1 = children[uVar6]->fURIId;
      if (uVar1 != 0xffffffff) {
        NVar2 = this->fChildTypes[uVar7];
        pQVar3 = this->fChildren[uVar7];
        if (NVar2 == Any_NS) {
          if (pQVar3->fURIId != uVar1) goto LAB_002ec4ae;
        }
        else if (NVar2 == Any_Other) {
          if ((uVar1 == 1) || (uVar1 == pQVar3->fURIId)) goto LAB_002ec4ae;
        }
        else if ((NVar2 == Leaf) &&
                (bVar4 = SubstitutionGroupComparator::isEquivalentTo
                                   (&local_40,children[uVar6],pQVar3), !bVar4)) goto LAB_002ec4ae;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      bVar4 = uVar5 < childCount;
      uVar6 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar4);
  }
  return true;
}

Assistant:

bool MixedContentModel::validateContentSpecial(QName** const          children
                                            , XMLSize_t               childCount
                                            , unsigned int
                                            , GrammarResolver*  const pGrammarResolver
                                            , XMLStringPool*    const pStringPool
                                            , XMLSize_t*              indexFailingChild
                                            , MemoryManager*    const) const
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    // must match order
    if (fOrdered) {
        unsigned int inIndex = 0;
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {

            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
            QName* inChild = fChildren[inIndex];

            if (type == ContentSpecNode::Leaf) {
                if ( !comparator.isEquivalentTo(curChild, inChild))
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any) {
            }
            else if (type == ContentSpecNode::Any_NS) {
                if (inChild->getURI() != curChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any_Other)
            {
                // Here we assume that empty string has id 1.
                //
                unsigned int uriId = curChild->getURI();
                if (uriId == 1 || uriId == inChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }

            // advance index
            inIndex++;
        }
    }

    // can appear in any order
    else {
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            unsigned int inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
                QName* inChild = fChildren[inIndex];

                if (type == ContentSpecNode::Leaf) {
                    if ( comparator.isEquivalentTo(curChild, inChild))
                        break;
                }
                else if (type == ContentSpecNode::Any) {
                    break;
                }
                else if (type == ContentSpecNode::Any_NS) {
                    if (inChild->getURI() == curChild->getURI())
                        break;
                }
                else if (type == ContentSpecNode::Any_Other)
                {
                  // Here we assume that empty string has id 1.
                  //
                  unsigned int uriId = curChild->getURI();
                  if (uriId != 1 && uriId != inChild->getURI())
                    break;
                }

                // REVISIT: What about checking for multiple ANY matches?
                //          The content model ambiguity *could* be checked
                //          by the caller before constructing the mixed
                //          content model.
            }
            // We did not find this one, so the validation failed
            if (inIndex == fCount)
            {
                *indexFailingChild=outIndex;
                return false;
            }
        }
    }

    // Everything seems to be in order, so return success
    return true;
}